

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTime.c
# Opt level: O0

void Map_TimePropagateRequired(Map_Man_t *p)

{
  float *pfVar1;
  Map_Node_t *p_00;
  int iVar2;
  uint uVar3;
  undefined8 *puVar4;
  Map_Time_t *pMVar5;
  Map_Time_t *pMVar6;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  int local_30;
  int k;
  int fPhase;
  Map_Time_t *ptReqOut;
  Map_Time_t *ptReqIn;
  Map_Node_t *pNode;
  Map_Man_t *p_local;
  
  local_30 = p->vMapObjs->nSize;
  while( true ) {
    while( true ) {
      do {
        local_30 = local_30 + -1;
        if (local_30 < 0) {
          return;
        }
        p_00 = p->vMapObjs->pArray[local_30];
      } while (p_00->nRefAct[2] == 0);
      iVar2 = Map_NodeIsBuf(p_00);
      if (iVar2 == 0) break;
      if (p_00->p2 != (Map_Node_t *)0x0) {
        __assert_fail("pNode->p2 == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTime.c"
                      ,0x131,"void Map_TimePropagateRequired(Map_Man_t *)");
      }
      puVar4 = (undefined8 *)
               (((ulong)p_00->p1 & 0xfffffffffffffffe) + 0x78 +
               (long)(int)((uint)p_00->p1 & 1) * 0xc);
      *puVar4 = *(undefined8 *)p_00->tRequired;
      *(float *)(puVar4 + 1) = p_00->tRequired[0].Worst;
      puVar4 = (undefined8 *)
               (((ulong)p_00->p1 & 0xfffffffffffffffe) + 0x78 +
               (long)(int)(uint)((((ulong)p_00->p1 & 1) != 0 ^ 0xffU) & 1) * 0xc);
      *puVar4 = *(undefined8 *)(p_00->tRequired + 1);
      *(float *)(puVar4 + 1) = p_00->tRequired[1].Worst;
    }
    if (((ulong)p_00 & 1) != 0) {
      __assert_fail("!Map_IsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTime.c"
                    ,0x138,"void Map_TimePropagateRequired(Map_Man_t *)");
    }
    if ((p_00->pCutBest[0] == (Map_Cut_t *)0x0) && (p_00->pCutBest[1] == (Map_Cut_t *)0x0)) break;
    if ((p_00->nRefAct[0] < 1) && (p_00->nRefAct[1] < 1)) {
      __assert_fail("pNode->nRefAct[0] > 0 || pNode->nRefAct[1] > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTime.c"
                    ,0x13c,"void Map_TimePropagateRequired(Map_Man_t *)");
    }
    if (((p_00->pCutBest[0] == (Map_Cut_t *)0x0) || (p_00->pCutBest[1] == (Map_Cut_t *)0x0)) &&
       (uVar3 = (uint)(p_00->pCutBest[1] == (Map_Cut_t *)0x0), 0 < p_00->nRefAct[(int)uVar3])) {
      pMVar5 = p_00->tRequired + (int)uVar3;
      pMVar6 = p_00->tRequired + (int)(uint)((uVar3 != 0 ^ 0xffU) & 1);
      if (pMVar5->Rise - (p->pSuperLib->tDelayInv).Rise <= pMVar6->Fall) {
        local_34 = pMVar5->Rise - (p->pSuperLib->tDelayInv).Rise;
      }
      else {
        local_34 = pMVar6->Fall;
      }
      pMVar6->Fall = local_34;
      if (pMVar5->Fall - (p->pSuperLib->tDelayInv).Fall <= pMVar6->Rise) {
        local_38 = pMVar5->Fall - (p->pSuperLib->tDelayInv).Fall;
      }
      else {
        local_38 = pMVar6->Rise;
      }
      pMVar6->Rise = local_38;
    }
    if (p_00->tRequired[0].Rise <= p_00->tRequired[0].Fall) {
      local_3c = p_00->tRequired[0].Rise;
    }
    else {
      local_3c = p_00->tRequired[0].Fall;
    }
    p_00->tRequired[0].Worst = local_3c;
    if (p_00->tRequired[1].Rise <= p_00->tRequired[1].Fall) {
      local_40 = p_00->tRequired[1].Rise;
    }
    else {
      local_40 = p_00->tRequired[1].Fall;
    }
    p_00->tRequired[1].Worst = local_40;
    iVar2 = Map_NodeIsAnd(p_00);
    if (iVar2 != 0) {
      if ((p_00->pCutBest[0] != (Map_Cut_t *)0x0) &&
         (pfVar1 = &p_00->tRequired[0].Worst, *pfVar1 <= 3.4028235e+37 && *pfVar1 != 3.4028235e+37))
      {
        Map_TimePropagateRequiredPhase(p,p_00,0);
      }
      if ((p_00->pCutBest[1] != (Map_Cut_t *)0x0) &&
         (pfVar1 = &p_00->tRequired[1].Worst, *pfVar1 <= 3.4028235e+37 && *pfVar1 != 3.4028235e+37))
      {
        Map_TimePropagateRequiredPhase(p,p_00,1);
      }
    }
  }
  __assert_fail("pNode->pCutBest[0] != NULL || pNode->pCutBest[1] != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTime.c"
                ,0x13a,"void Map_TimePropagateRequired(Map_Man_t *)");
}

Assistant:

void Map_TimePropagateRequired( Map_Man_t * p )
{
    Map_Node_t * pNode;
    //Map_Time_t tReqOutTest, * ptReqOutTest = &tReqOutTest;
    Map_Time_t * ptReqIn, * ptReqOut;
    int fPhase, k;

    // go through the nodes in the reverse topological order
    for ( k = p->vMapObjs->nSize - 1; k >= 0; k-- )
    {
        pNode = p->vMapObjs->pArray[k];
        if ( pNode->nRefAct[2] == 0 )
            continue;

        // propagate required times through the buffer
        if ( Map_NodeIsBuf(pNode) )
        {
            assert( pNode->p2 == NULL );
            Map_Regular(pNode->p1)->tRequired[ Map_IsComplement(pNode->p1)] = pNode->tRequired[0];
            Map_Regular(pNode->p1)->tRequired[!Map_IsComplement(pNode->p1)] = pNode->tRequired[1];
            continue;
        }

        // this computation works for regular nodes only
        assert( !Map_IsComplement(pNode) );
        // at least one phase should be mapped
        assert( pNode->pCutBest[0] != NULL || pNode->pCutBest[1] != NULL );
        // the node should be used in the currently assigned mapping
        assert( pNode->nRefAct[0] > 0 || pNode->nRefAct[1] > 0 );

        // if one of the cuts is not given, project the required times from the other cut
        if ( pNode->pCutBest[0] == NULL || pNode->pCutBest[1] == NULL )
        {
//            assert( 0 );
            // get the missing phase 
            fPhase = (pNode->pCutBest[1] == NULL); 
            // check if the missing phase is needed in the mapping
            if ( pNode->nRefAct[fPhase] > 0 )
            {
                // get the pointers to the required times of the missing phase
                ptReqOut = pNode->tRequired +  fPhase;
//                assert( ptReqOut->Fall < MAP_FLOAT_LARGE );
                // get the pointers to the required times of the present phase
                ptReqIn  = pNode->tRequired + !fPhase;
                // propagate the required times from the missing phase to the present phase
    //            tArrInv.Fall  = pMatch->tArrive.Rise + p->pSuperLib->tDelayInv.Fall;
    //            tArrInv.Rise  = pMatch->tArrive.Fall + p->pSuperLib->tDelayInv.Rise;
                ptReqIn->Fall = MAP_MIN( ptReqIn->Fall, ptReqOut->Rise - p->pSuperLib->tDelayInv.Rise );
                ptReqIn->Rise = MAP_MIN( ptReqIn->Rise, ptReqOut->Fall - p->pSuperLib->tDelayInv.Fall );
            }
        }

        // finalize the worst case computation
        pNode->tRequired[0].Worst = MAP_MIN( pNode->tRequired[0].Fall, pNode->tRequired[0].Rise );
        pNode->tRequired[1].Worst = MAP_MIN( pNode->tRequired[1].Fall, pNode->tRequired[1].Rise );

        // skip the PIs
        if ( !Map_NodeIsAnd(pNode) )
            continue;

        // propagate required times of different phases of the node
        // the ordering of phases does not matter since they are mapped independently
        if ( pNode->pCutBest[0] && pNode->tRequired[0].Worst < MAP_FLOAT_LARGE )
            Map_TimePropagateRequiredPhase( p, pNode, 0 );
        if ( pNode->pCutBest[1] && pNode->tRequired[1].Worst < MAP_FLOAT_LARGE )
            Map_TimePropagateRequiredPhase( p, pNode, 1 );
    }
/*
    // in the end, we verify the required times
    // for this, we compute the arrival times of the outputs of each phase 
    // of the supergates using the fanins' required times as the fanins' arrival times
    // the resulting arrival time of the supergate should be less than the actual required time
    for ( k = p->vMapObjs->nSize - 1; k >= 0; k-- )
    {
        pNode = p->vMapObjs->pArray[k];
        if ( pNode->nRefAct[2] == 0 )
            continue;
        if ( !Map_NodeIsAnd(pNode) )
            continue;
        // verify that the required times are propagated correctly
//        if ( pNode->pCutBest[0] && (pNode->nRefAct[0] > 0 || pNode->pCutBest[1] == NULL) )
        if ( pNode->pCutBest[0] && pNode->tRequired[0].Worst < MAP_FLOAT_LARGE/2 )
        {
            Map_MatchComputeReqTimes( pNode->pCutBest[0], 0, ptReqOutTest );
//            assert( ptReqOutTest->Rise < pNode->tRequired[0].Rise + p->fEpsilon );
//            assert( ptReqOutTest->Fall < pNode->tRequired[0].Fall + p->fEpsilon );
        }
//        if ( pNode->pCutBest[1] && (pNode->nRefAct[1] > 0 || pNode->pCutBest[0] == NULL) )
        if ( pNode->pCutBest[1] && pNode->tRequired[1].Worst < MAP_FLOAT_LARGE/2 )
        {
            Map_MatchComputeReqTimes( pNode->pCutBest[1], 1, ptReqOutTest );
//            assert( ptReqOutTest->Rise < pNode->tRequired[1].Rise + p->fEpsilon );
//            assert( ptReqOutTest->Fall < pNode->tRequired[1].Fall + p->fEpsilon );
        }
    }
*/
}